

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422ToARGB1555Row_SSSE3
               (uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_argb1555,
               YuvConstants *yuvconstants,int width)

{
  int width_00;
  ulong uVar1;
  uint8_t row [8192];
  uint8_t *local_2070;
  uint8_t local_2060 [8240];
  
  local_2070 = dst_argb1555;
  for (; 0 < width; width = width - width_00) {
    uVar1 = 0x800;
    if ((uint)width < 0x800) {
      uVar1 = (ulong)(uint)width;
    }
    width_00 = (int)uVar1;
    I422ToARGBRow_SSSE3(src_y,src_u,src_v,local_2060,yuvconstants,width_00);
    ARGBToARGB1555Row_SSE2(local_2060,local_2070,width_00);
    src_y = src_y + uVar1;
    src_u = src_u + (uVar1 >> 1);
    src_v = src_v + (uVar1 >> 1);
    local_2070 = local_2070 + uVar1 * 2;
  }
  return;
}

Assistant:

void I422ToARGB1555Row_SSSE3(const uint8_t* src_y,
                             const uint8_t* src_u,
                             const uint8_t* src_v,
                             uint8_t* dst_argb1555,
                             const struct YuvConstants* yuvconstants,
                             int width) {
  // Row buffer for intermediate ARGB pixels.
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    I422ToARGBRow_SSSE3(src_y, src_u, src_v, row, yuvconstants, twidth);
    ARGBToARGB1555Row_SSE2(row, dst_argb1555, twidth);
    src_y += twidth;
    src_u += twidth / 2;
    src_v += twidth / 2;
    dst_argb1555 += twidth * 2;
    width -= twidth;
  }
}